

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3DbMallocRawNN(sqlite3 *db,u64 n)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  LookasideSlot *pLVar4;
  void *pvVar5;
  
  if ((db->lookaside).bDisable != 0) {
    if (db->mallocFailed != '\0') {
      return (void *)0x0;
    }
    pvVar5 = sqlite3Malloc(n);
    if (pvVar5 == (void *)0x0) {
      sqlite3OomFault(db);
    }
    return pvVar5;
  }
  if ((db->lookaside).sz < n) {
    piVar2 = (db->lookaside).anStat + 1;
    *piVar2 = *piVar2 + 1;
    pvVar5 = dbMallocRawFinish(db,n);
    return pvVar5;
  }
  pLVar4 = (db->lookaside).pFree;
  if (pLVar4 != (LookasideSlot *)0x0) {
    (db->lookaside).pFree = pLVar4->pNext;
    iVar3 = (db->lookaside).nOut;
    iVar1 = iVar3 + 1;
    (db->lookaside).nOut = iVar1;
    piVar2 = (db->lookaside).anStat;
    *piVar2 = *piVar2 + 1;
    if ((db->lookaside).mxOut <= iVar3) {
      (db->lookaside).mxOut = iVar1;
    }
    return pLVar4;
  }
  piVar2 = (db->lookaside).anStat + 2;
  *piVar2 = *piVar2 + 1;
  pvVar5 = dbMallocRawFinish(db,n);
  return pvVar5;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRawNN(sqlite3 *db, u64 n){
#ifndef SQLITE_OMIT_LOOKASIDE
  LookasideSlot *pBuf;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->lookaside.bDisable==0 ){
    assert( db->mallocFailed==0 );
    if( n>db->lookaside.sz ){
      db->lookaside.anStat[1]++;
    }else if( (pBuf = db->lookaside.pFree)==0 ){
      db->lookaside.anStat[2]++;
    }else{
      db->lookaside.pFree = pBuf->pNext;
      db->lookaside.nOut++;
      db->lookaside.anStat[0]++;
      if( db->lookaside.nOut>db->lookaside.mxOut ){
        db->lookaside.mxOut = db->lookaside.nOut;
      }
      return (void*)pBuf;
    }
  }else if( db->mallocFailed ){
    return 0;
  }
#else
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->mallocFailed ){
    return 0;
  }
#endif
  return dbMallocRawFinish(db, n);
}